

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O2

void __thiscall Assimp::STEP::DB::SetTypesToTrack(DB *this,char **types,size_t N)

{
  _Rb_tree<const_Assimp::STEP::LazyObject_*,_const_Assimp::STEP::LazyObject_*,_std::_Identity<const_Assimp::STEP::LazyObject_*>,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
  *this_00;
  size_t sVar1;
  allocator<char> local_89;
  _Rb_tree<const_Assimp::STEP::LazyObject_*,_const_Assimp::STEP::LazyObject_*,_std::_Identity<const_Assimp::STEP::LazyObject_*>,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
  local_88;
  key_type local_50;
  
  for (sVar1 = 0; N != sVar1; sVar1 = sVar1 + 1) {
    local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_88._M_impl._0_8_ = 0;
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_88._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_88._M_impl.super__Rb_tree_header._M_header;
    local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_88._M_impl.super__Rb_tree_header._M_header._M_right =
         local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,types[sVar1],&local_89);
    this_00 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
               ::operator[](&this->objects_bytype,&local_50)->_M_t;
    std::
    _Rb_tree<const_Assimp::STEP::LazyObject_*,_const_Assimp::STEP::LazyObject_*,_std::_Identity<const_Assimp::STEP::LazyObject_*>,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
    ::operator=(this_00,&local_88);
    std::__cxx11::string::~string((string *)&local_50);
    std::
    _Rb_tree<const_Assimp::STEP::LazyObject_*,_const_Assimp::STEP::LazyObject_*,_std::_Identity<const_Assimp::STEP::LazyObject_*>,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
    ::~_Rb_tree(&local_88);
  }
  return;
}

Assistant:

void SetTypesToTrack(const char* const* types, size_t N) {
            for(size_t i = 0; i < N;++i) {
                objects_bytype[types[i]] = ObjectSet();
            }
        }